

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

void __thiscall TransferFunctionITU::~TransferFunctionITU(TransferFunctionITU *this)

{
  operator_delete(this,0x18);
  return;
}

Assistant:

float encode(const float intensity) const override {
        float brightness;

        if (intensity < linearCutoff_)
            brightness = intensity * linearExpansion_;
        else
            brightness = 1.099f * pow(intensity, oeGamma_) - 0.099f;

        return brightness;
    }